

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_session_ticket(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  ptls_context_t *ctx;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var1;
  st_ptls_encrypt_ticket_t *psVar2;
  ptls_buffer_t *ppVar3;
  uint32_t ticket_age_add_00;
  st_ptls_hash_context_t *psVar4;
  ulong uVar5;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_260;
  size_t body_size_2;
  size_t body_size_5;
  size_t body_size_6;
  size_t sStack_208;
  uint32_t _v_3;
  size_t body_start_6;
  size_t capacity_6;
  size_t sStack_1f0;
  uint16_t _v_2;
  size_t body_start_5;
  size_t capacity_5;
  size_t body_size_4;
  size_t local_1c8;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  undefined1 local_198;
  undefined1 local_197;
  undefined1 local_196;
  undefined1 local_195;
  uint32_t _v_1;
  long lStack_190;
  uint32_t _v;
  size_t body_start_2;
  size_t capacity_2;
  size_t local_178;
  size_t mess_start_2;
  ptls_key_schedule_t *_key_sched_2;
  ptls_buffer_t *_buf_2;
  ptls_message_emitter_t *_emitter;
  ulong local_148;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t local_128;
  size_t mess_start_1;
  ptls_key_schedule_t *_key_sched_1;
  ptls_buffer_t *_buf_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t local_f0;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  size_t orig_off;
  int ret;
  uint32_t ticket_age_add;
  char session_id_smallbuf [128];
  ptls_buffer_t session_id;
  ptls_hash_context_t *msghash_backup;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  psVar4 = (*(tls->key_schedule->hashes[0].ctx)->clone_)(tls->key_schedule->hashes[0].ctx);
  orig_off._0_4_ = 0;
  if (tls->ctx->ticket_lifetime == 0) {
    __assert_fail("tls->ctx->ticket_lifetime != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x755,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  if (tls->ctx->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
    __assert_fail("tls->ctx->encrypt_ticket != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x756,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  ptls_buffer_init((ptls_buffer_t *)(session_id_smallbuf + 0x78),&ret,0x80);
  _buf = (ptls_buffer_t *)emitter->buf->off;
  if ((tls->pending_handshake_secret != (uint8_t *)0x0) &&
     (((byte)tls->ctx->field_0xb8 >> 4 & 1) == 0)) {
    if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
      __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x75d,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    _key_sched = (ptls_key_schedule_t *)emitter->buf;
    mess_start = (size_t)tls->key_schedule;
    local_f0 = *(size_t *)(_key_sched->secret + 0xc);
    capacity._7_1_ = 5;
    orig_off._0_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
    if ((int)orig_off != 0) goto LAB_0012717d;
    body_start = 3;
    orig_off._0_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
    if ((int)orig_off != 0) goto LAB_0012717d;
    body_size = *(size_t *)(_key_sched->secret + 0xc);
    _buf_1 = (ptls_buffer_t *)(*(long *)(_key_sched->secret + 0xc) - body_size);
    if (body_start == 0xffffffffffffffff) {
      orig_off._0_4_ =
           ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)_key_sched,(size_t)_buf_1);
      if ((int)orig_off != 0) goto LAB_0012717d;
    }
    else {
      if ((body_start < 8) && ((ptls_buffer_t *)(1L << ((byte)(body_start << 3) & 0x3f)) <= _buf_1))
      {
        orig_off._0_4_ = 0x20c;
        goto LAB_0012717d;
      }
      for (; body_start != 0; body_start = body_start - 1) {
        *(char *)(*(long *)_key_sched + (body_size - body_start)) =
             (char)((ulong)_buf_1 >> (((char)body_start + -1) * '\b' & 0x3fU));
      }
    }
    orig_off._0_4_ = 0;
    if (mess_start != 0) {
      ptls__key_schedule_update_hash
                ((ptls_key_schedule_t *)mess_start,(uint8_t *)(*(long *)_key_sched + local_f0),
                 *(long *)(_key_sched->secret + 0xc) - local_f0,0);
    }
    emitter->buf->off = (size_t)_buf;
  }
  _key_sched_1 = (ptls_key_schedule_t *)emitter->buf;
  mess_start_1 = (size_t)tls->key_schedule;
  local_128 = *(size_t *)(_key_sched_1->secret + 0xc);
  capacity_1._7_1_ = 0x14;
  orig_off._0_4_ =
       ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_1,(void *)((long)&capacity_1 + 7),1);
  if ((int)orig_off == 0) {
    body_start_1 = 3;
    orig_off._0_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_1,"",3);
    if ((int)orig_off == 0) {
      body_size_1 = *(size_t *)(_key_sched_1->secret + 0xc);
      orig_off._0_4_ =
           ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
      if ((int)orig_off == 0) {
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
          local_260 = &tls->traffic_protection;
        }
        else {
          local_260 = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)
                      tls->pending_handshake_secret;
        }
        orig_off._0_4_ =
             calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,local_260);
        if ((int)orig_off == 0) {
          emitter->buf->off = (tls->key_schedule->hashes[0].algo)->digest_size + emitter->buf->off;
          local_148 = *(long *)(_key_sched_1->secret + 0xc) - body_size_1;
          if (body_start_1 == 0xffffffffffffffff) {
            orig_off._0_4_ =
                 ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)_key_sched_1,local_148);
            if ((int)orig_off != 0) goto LAB_0012717d;
          }
          else {
            if ((body_start_1 < 8) &&
               ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= local_148)) {
              orig_off._0_4_ = 0x20c;
              goto LAB_0012717d;
            }
            for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
              *(char *)(*(long *)_key_sched_1 + (body_size_1 - body_start_1)) =
                   (char)(local_148 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
            }
          }
          orig_off._0_4_ = 0;
          if (mess_start_1 != 0) {
            ptls__key_schedule_update_hash
                      ((ptls_key_schedule_t *)mess_start_1,
                       (uint8_t *)(*(long *)_key_sched_1 + local_128),
                       *(long *)(_key_sched_1->secret + 0xc) - local_128,0);
          }
          emitter->buf->off = (size_t)_buf;
          (*tls->ctx->random_bytes)((void *)((long)&orig_off + 4),4);
          ticket_age_add_00 = orig_off._4_4_;
          if (tls->key_share != (ptls_key_exchange_algorithm_t *)0x0) {
            ctx = tls->ctx;
            __emitter = ptls_iovec_init((void *)0x0,0);
            orig_off._0_4_ =
                 encode_session_identifier
                           (ctx,(ptls_buffer_t *)(session_id_smallbuf + 0x78),ticket_age_add_00,
                            __emitter,tls->key_schedule,tls->server_name,tls->key_share->id,
                            tls->cipher_suite->id,tls->negotiated_protocol);
            if ((int)orig_off != 0) goto LAB_0012717d;
          }
          _buf_2 = (ptls_buffer_t *)emitter;
          orig_off._0_4_ = (*emitter->begin_message)(emitter);
          if ((int)orig_off == 0) {
            _key_sched_2 = (ptls_key_schedule_t *)_buf_2->base;
            mess_start_2 = (size_t)tls->key_schedule;
            local_178 = *(size_t *)(_key_sched_2->secret + 0xc);
            capacity_2._7_1_ = 4;
            orig_off._0_4_ =
                 ptls_buffer__do_pushv
                           ((ptls_buffer_t *)_key_sched_2,(void *)((long)&capacity_2 + 7),1);
            if ((int)orig_off == 0) {
              body_start_2 = 3;
              orig_off._0_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_2,"",3);
              if ((int)orig_off == 0) {
                lStack_190 = *(long *)(_key_sched_2->secret + 0xc);
                _v_1 = tls->ctx->ticket_lifetime;
                local_198 = (undefined1)(_v_1 >> 0x18);
                local_197 = (undefined1)(_v_1 >> 0x10);
                local_196 = (undefined1)(_v_1 >> 8);
                local_195 = (undefined1)_v_1;
                orig_off._0_4_ = ptls_buffer__do_pushv(emitter->buf,&local_198,4);
                if ((int)orig_off == 0) {
                  capacity_3._4_4_ = orig_off._4_4_;
                  capacity_3._0_1_ = (undefined1)(orig_off._4_4_ >> 0x18);
                  capacity_3._1_1_ = (undefined1)(orig_off._4_4_ >> 0x10);
                  capacity_3._2_1_ = (undefined1)(orig_off._4_4_ >> 8);
                  capacity_3._3_1_ = (undefined1)orig_off._4_4_;
                  orig_off._0_4_ = ptls_buffer__do_pushv(emitter->buf,&capacity_3,4);
                  if ((int)orig_off == 0) {
                    body_start_3 = 1;
                    orig_off._0_4_ = ptls_buffer__do_pushv(emitter->buf,"",1);
                    if ((int)orig_off == 0) {
                      body_size_3 = emitter->buf->off;
                      capacity_4 = emitter->buf->off - body_size_3;
                      if (body_start_3 == 0xffffffffffffffff) {
                        orig_off._0_4_ = ptls_buffer__adjust_quic_blocksize(emitter->buf,capacity_4)
                        ;
                        if ((int)orig_off != 0) goto LAB_0012717d;
                      }
                      else {
                        if ((body_start_3 < 8) &&
                           ((ulong)(1L << ((byte)(body_start_3 << 3) & 0x3f)) <= capacity_4)) {
                          orig_off._0_4_ = 0x20c;
                          goto LAB_0012717d;
                        }
                        for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
                          emitter->buf->base[body_size_3 - body_start_3] =
                               (uint8_t)(capacity_4 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
                        }
                      }
                      orig_off._0_4_ = 0;
                      body_start_4 = 2;
                      orig_off._0_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
                      if ((int)orig_off == 0) {
                        local_1c8 = emitter->buf->off;
                        p_Var1 = tls->ctx->encrypt_ticket->cb;
                        psVar2 = tls->ctx->encrypt_ticket;
                        ppVar3 = emitter->buf;
                        _body_size_4 = ptls_iovec_init((void *)session_id_smallbuf._120_8_,
                                                       session_id.capacity);
                        orig_off._0_4_ = (*p_Var1)(psVar2,tls,1,ppVar3,_body_size_4);
                        if ((int)orig_off == 0) {
                          capacity_5 = emitter->buf->off - local_1c8;
                          if (body_start_4 == 0xffffffffffffffff) {
                            orig_off._0_4_ =
                                 ptls_buffer__adjust_quic_blocksize(emitter->buf,capacity_5);
                            if ((int)orig_off != 0) goto LAB_0012717d;
                          }
                          else {
                            if ((body_start_4 < 8) &&
                               ((ulong)(1L << ((byte)(body_start_4 << 3) & 0x3f)) <= capacity_5)) {
                              orig_off._0_4_ = 0x20c;
                              goto LAB_0012717d;
                            }
                            for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                              emitter->buf->base[local_1c8 - body_start_4] =
                                   (uint8_t)(capacity_5 >>
                                            (((char)body_start_4 + -1) * '\b' & 0x3fU));
                            }
                          }
                          orig_off._0_4_ = 0;
                          body_start_5 = 2;
                          orig_off._0_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
                          if ((int)orig_off == 0) {
                            sStack_1f0 = emitter->buf->off;
                            if (tls->ctx->max_early_data_size != 0) {
                              capacity_6._6_2_ = 0x2a;
                              capacity_6._4_1_ = 0;
                              capacity_6._5_1_ = 0x2a;
                              orig_off._0_4_ =
                                   ptls_buffer__do_pushv
                                             (emitter->buf,(void *)((long)&capacity_6 + 4),2);
                              if ((int)orig_off != 0) goto LAB_0012717d;
                              body_start_6 = 2;
                              orig_off._0_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
                              if ((int)orig_off != 0) goto LAB_0012717d;
                              sStack_208 = emitter->buf->off;
                              body_size_6._4_4_ = tls->ctx->max_early_data_size;
                              body_size_6._0_1_ = (undefined1)(body_size_6._4_4_ >> 0x18);
                              body_size_6._1_1_ = (undefined1)(body_size_6._4_4_ >> 0x10);
                              body_size_6._2_1_ = (undefined1)(body_size_6._4_4_ >> 8);
                              body_size_6._3_1_ = (undefined1)body_size_6._4_4_;
                              orig_off._0_4_ = ptls_buffer__do_pushv(emitter->buf,&body_size_6,4);
                              if ((int)orig_off != 0) goto LAB_0012717d;
                              uVar5 = emitter->buf->off - sStack_208;
                              if (body_start_6 == 0xffffffffffffffff) {
                                orig_off._0_4_ =
                                     ptls_buffer__adjust_quic_blocksize(emitter->buf,uVar5);
                                if ((int)orig_off != 0) goto LAB_0012717d;
                              }
                              else {
                                if ((body_start_6 < 8) &&
                                   ((ulong)(1L << ((byte)(body_start_6 << 3) & 0x3f)) <= uVar5)) {
                                  orig_off._0_4_ = 0x20c;
                                  goto LAB_0012717d;
                                }
                                for (; body_start_6 != 0; body_start_6 = body_start_6 - 1) {
                                  emitter->buf->base[sStack_208 - body_start_6] =
                                       (uint8_t)(uVar5 >> (((char)body_start_6 + -1) * '\b' & 0x3fU)
                                                );
                                }
                              }
                            }
                            orig_off._0_4_ = 0;
                            uVar5 = emitter->buf->off - sStack_1f0;
                            if (body_start_5 == 0xffffffffffffffff) {
                              orig_off._0_4_ =
                                   ptls_buffer__adjust_quic_blocksize(emitter->buf,uVar5);
                              if ((int)orig_off != 0) goto LAB_0012717d;
                            }
                            else {
                              if ((body_start_5 < 8) &&
                                 ((ulong)(1L << ((byte)(body_start_5 << 3) & 0x3f)) <= uVar5)) {
                                orig_off._0_4_ = 0x20c;
                                goto LAB_0012717d;
                              }
                              for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
                                emitter->buf->base[sStack_1f0 - body_start_5] =
                                     (uint8_t)(uVar5 >> (((char)body_start_5 + -1) * '\b' & 0x3fU));
                              }
                            }
                            orig_off._0_4_ = 0;
                            uVar5 = *(long *)(_key_sched_2->secret + 0xc) - lStack_190;
                            if (body_start_2 == 0xffffffffffffffff) {
                              orig_off._0_4_ =
                                   ptls_buffer__adjust_quic_blocksize
                                             ((ptls_buffer_t *)_key_sched_2,uVar5);
                              if ((int)orig_off != 0) goto LAB_0012717d;
                            }
                            else {
                              if ((body_start_2 < 8) &&
                                 ((ulong)(1L << ((byte)(body_start_2 << 3) & 0x3f)) <= uVar5)) {
                                orig_off._0_4_ = 0x20c;
                                goto LAB_0012717d;
                              }
                              for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                                *(char *)(*(long *)_key_sched_2 + (lStack_190 - body_start_2)) =
                                     (char)(uVar5 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
                              }
                            }
                            orig_off._0_4_ = 0;
                            if (mess_start_2 != 0) {
                              ptls__key_schedule_update_hash
                                        ((ptls_key_schedule_t *)mess_start_2,
                                         (uint8_t *)(*(long *)_key_sched_2 + local_178),
                                         *(long *)(_key_sched_2->secret + 0xc) - local_178,0);
                            }
                            orig_off._0_4_ = (*(code *)_buf_2[1].base)(_buf_2);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012717d:
  ptls_buffer_dispose((ptls_buffer_t *)(session_id_smallbuf + 0x78));
  (*(tls->key_schedule->hashes[0].ctx)->final)
            (tls->key_schedule->hashes[0].ctx,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
  tls->key_schedule->hashes[0].ctx = psVar4;
  return (int)orig_off;
}

Assistant:

static int send_session_ticket(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    ptls_hash_context_t *msghash_backup = tls->key_schedule->hashes[0].ctx->clone_(tls->key_schedule->hashes[0].ctx);
    ptls_buffer_t session_id;
    char session_id_smallbuf[128];
    uint32_t ticket_age_add;
    int ret = 0;

    assert(tls->ctx->ticket_lifetime != 0);
    assert(tls->ctx->encrypt_ticket != NULL);

    ptls_buffer_init(&session_id, session_id_smallbuf, sizeof(session_id_smallbuf));

    { /* calculate verify-data that will be sent by the client */
        size_t orig_off = emitter->buf->off;
        if (tls->pending_handshake_secret != NULL && !tls->ctx->omit_end_of_early_data) {
            assert(tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);
            ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA, {});
            emitter->buf->off = orig_off;
        }
        ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
            if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                goto Exit;
            if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                        tls->pending_handshake_secret != NULL ? tls->pending_handshake_secret
                                                                              : tls->traffic_protection.dec.secret)) != 0)
                goto Exit;
            emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
        });
        emitter->buf->off = orig_off;
    }

    tls->ctx->random_bytes(&ticket_age_add, sizeof(ticket_age_add));

    /* build the raw nsk */
    if (tls->key_share != NULL && (ret = encode_session_identifier(tls->ctx, &session_id, ticket_age_add, ptls_iovec_init(NULL, 0),
                                                                   tls->key_schedule, tls->server_name, tls->key_share->id,
                                                                   tls->cipher_suite->id, tls->negotiated_protocol)) != 0)
        goto Exit;

    /* encrypt and send */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, {
        ptls_buffer_push32(emitter->buf, tls->ctx->ticket_lifetime);
        ptls_buffer_push32(emitter->buf, ticket_age_add);
        ptls_buffer_push_block(emitter->buf, 1, {});
        ptls_buffer_push_block(emitter->buf, 2, {
            if ((ret = tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 1, emitter->buf,
                                                    ptls_iovec_init(session_id.base, session_id.off))) != 0)
                goto Exit;
        });
        ptls_buffer_push_block(emitter->buf, 2, {
            if (tls->ctx->max_early_data_size != 0)
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_EARLY_DATA,
                                      { ptls_buffer_push32(emitter->buf, tls->ctx->max_early_data_size); });
        });
    });

Exit:
    ptls_buffer_dispose(&session_id);

    /* restore handshake state */
    tls->key_schedule->hashes[0].ctx->final(tls->key_schedule->hashes[0].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
    tls->key_schedule->hashes[0].ctx = msghash_backup;

    return ret;
}